

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O3

void * QArrayData::allocate1(QArrayData **dptr,qsizetype capacity,AllocationOption option)

{
  QArrayData *pQVar1;
  void *pvVar2;
  size_t __size;
  CalculateGrowingBlockSizeResult CVar3;
  
  if (capacity != 0) {
    if (option == Grow) {
      CVar3 = qCalculateGrowingBlockSize(capacity,1,0x12);
      capacity = CVar3.elementCount;
      __size = CVar3.size;
    }
    else {
      if (0xffffffffffffffed < (ulong)capacity) goto LAB_00105fdd;
      __size = 0xffffffffffffffff;
      if (-1 < (long)(capacity + 0x12U)) {
        __size = capacity + 0x12U;
      }
    }
    if (-1 < (long)__size) {
      pQVar1 = (QArrayData *)malloc(__size);
      if (pQVar1 != (QArrayData *)0x0) {
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i = 1;
        (pQVar1->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
        super_QFlagsStorage<QArrayData::ArrayOption>.i = 0;
        pvVar2 = (void *)((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0);
        pQVar1->alloc = capacity;
        goto LAB_00105fe1;
      }
    }
  }
LAB_00105fdd:
  pvVar2 = (void *)0x0;
  pQVar1 = (QArrayData *)0x0;
LAB_00105fe1:
  *dptr = pQVar1;
  return pvVar2;
}

Assistant:

void *QArrayData::allocate1(QArrayData **dptr, qsizetype capacity, AllocationOption option) noexcept
{
    Q_ASSERT(dptr);

    auto r = allocateHelper(1, alignof(AlignedQArrayData), capacity, option);
    *dptr = r.header;
    return r.data;
}